

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ways.cxx
# Opt level: O0

void __thiscall read_point_le::operator()(read_point_le *this,way_point_le *point,xr_reader *r)

{
  uint16_t uVar1;
  uint32_t uVar2;
  xr_reader *r_local;
  way_point_le *point_local;
  read_point_le *this_local;
  
  xray_re::xr_reader::r_fvector3(r,&(point->super_way_point).position);
  uVar2 = xray_re::xr_reader::r_u32(r);
  (point->super_way_point).flags = uVar2;
  uVar1 = xray_re::xr_reader::r_u16(r);
  point->id = uVar1;
  xray_re::xr_reader::r_sz(r,(string *)point);
  return;
}

Assistant:

void operator()(way_point_le& point, xr_reader& r) {
	r.r_fvector3(point.position);
	point.flags = r.r_u32();
	point.id = r.r_u16();
	r.r_sz(point.name);
}